

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

ElabSystemTaskSyntax * __thiscall
slang::parsing::Parser::parseElabSystemTask(Parser *this,AttrList attributes)

{
  bool bVar1;
  ArgumentListSyntax *arguments;
  ElabSystemTaskSyntax *pEVar2;
  string_view __x;
  Token name;
  Token semi;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __y_02;
  basic_string_view<char,_std::char_traits<char>_> __y_03;
  Token local_68;
  SyntaxNode *local_58;
  SyntaxNode *pSStack_50;
  size_t local_48;
  pointer local_40;
  __extent_storage<18446744073709551615UL> local_38;
  
  local_68 = ParserBase::peek(&this->super_ParserBase);
  __x = Token::valueText(&local_68);
  __y._M_str = "$fatal";
  __y._M_len = 6;
  bVar1 = std::operator==(__x,__y);
  if ((((!bVar1) &&
       (__y_00._M_str = "$error", __y_00._M_len = 6, bVar1 = std::operator==(__x,__y_00), !bVar1))
      && (__y_01._M_str = "$warning", __y_01._M_len = 8, bVar1 = std::operator==(__x,__y_01), !bVar1
         )) && ((__y_02._M_str = "$info", __y_02._M_len = 5, bVar1 = std::operator==(__x,__y_02),
                !bVar1 && (__y_03._M_str = "$static_assert", __y_03._M_len = 0xe,
                          bVar1 = std::operator==(__x,__y_03), !bVar1)))) {
    return (ElabSystemTaskSyntax *)0x0;
  }
  name = ParserBase::consume(&this->super_ParserBase);
  bVar1 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
  if (bVar1) {
    arguments = parseArgumentList(this);
  }
  else {
    arguments = (ArgumentListSyntax *)0x0;
  }
  local_68.info._0_4_ = 1;
  local_58 = (SyntaxNode *)0x0;
  pSStack_50 = (SyntaxNode *)0x0;
  local_68._0_8_ = &PTR_getChild_005a2b60;
  local_48 = attributes._M_extent._M_extent_value._M_extent_value;
  local_40 = attributes._M_ptr;
  local_38._M_extent_value = attributes._M_extent._M_extent_value._M_extent_value;
  semi = ParserBase::expect(&this->super_ParserBase,Semicolon);
  pEVar2 = slang::syntax::SyntaxFactory::elabSystemTask
                     (&this->factory,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&local_68
                      ,name,arguments,semi);
  return pEVar2;
}

Assistant:

ElabSystemTaskSyntax* Parser::parseElabSystemTask(AttrList attributes) {
    auto name = peek().valueText();
    if (name != "$fatal"sv && name != "$error"sv && name != "$warning"sv && name != "$info"sv &&
        name != "$static_assert"sv) {
        return nullptr;
    }

    auto nameToken = consume();
    ArgumentListSyntax* argList = nullptr;
    if (peek(TokenKind::OpenParenthesis))
        argList = &parseArgumentList();

    return &factory.elabSystemTask(attributes, nameToken, argList, expect(TokenKind::Semicolon));
}